

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

bool __thiscall
tinyusdz::Prim::replace_child(Prim *this,string *child_prim_name,Prim *rhs,string *err)

{
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  Value *rhs_00;
  Path *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_t sVar4;
  Prim *pPVar5;
  _Alloc_hider __s2;
  size_type sVar6;
  bool bVar7;
  int iVar8;
  size_type sVar9;
  string *psVar10;
  char *pcVar11;
  char *pcVar12;
  key_type *__k;
  pointer this_02;
  pointer pPVar13;
  ulong uVar14;
  long lVar15;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar16;
  _Alloc_node __an;
  string local_180;
  pointer local_160;
  Prim *local_158;
  string *local_150;
  long *local_148;
  long local_140;
  long local_138 [2];
  Path local_128;
  pointer local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  psVar10 = err;
  local_158 = rhs;
  if ((err != (string *)0x0) && (child_prim_name->_M_string_length == 0)) {
    ::std::__cxx11::string::append((char *)err);
  }
  bVar7 = ValidatePrimElementName(child_prim_name);
  if ((err != (string *)0x0) && (!bVar7)) {
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"`{}` is not a valid Prim name.\n","");
    fmt::format<std::__cxx11::string>
              (&local_128._prim_part,(fmt *)&local_180,(string *)child_prim_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10);
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_128._prim_part._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._prim_part._M_dataplus._M_p != &local_128._prim_part.field_2) {
      operator_delete(local_128._prim_part._M_dataplus._M_p,
                      local_128._prim_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = &this->_childrenNameSet;
  local_150 = err;
  if (((long)(this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_start >> 4) * 0x21cfb2b78c13521d -
      (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00,
               (_Link_type)
               (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    p_Var1 = &(this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header;
    (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pPVar13 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_start;
    bVar7 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
            _M_impl.super__Vector_impl_data._M_finish != pPVar13;
    if (bVar7) {
      lVar15 = 0x1a0;
      uVar14 = 0;
      do {
        if (*(long *)((long)&(pPVar13->_abs_path)._prim_part._M_string_length + lVar15) == 0) {
          if (local_150 != (string *)0x0) {
            pcVar12 = (char *)local_150->_M_string_length;
            pcVar11 = "Internal error: Existing child Prim\'s elementName is empty.\n";
LAB_0029c2a3:
            ::std::__cxx11::string::_M_replace((ulong)local_150,0,pcVar12,(ulong)pcVar11);
          }
LAB_0029c2aa:
          if (bVar7) {
            return false;
          }
          break;
        }
        sVar9 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_00,
                        (key_type *)
                        ((long)&(pPVar13->_abs_path)._prim_part._M_dataplus._M_p + lVar15));
        if (sVar9 != 0) {
          if (local_150 != (string *)0x0) {
            pcVar12 = (char *)local_150->_M_string_length;
            pcVar11 = "Internal error: _children contains Prim with same elementName.\n";
            goto LAB_0029c2a3;
          }
          goto LAB_0029c2aa;
        }
        __k = (key_type *)
              ((long)&(((this->_children).
                        super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                        super__Vector_impl_data._M_start)->_abs_path)._prim_part._M_dataplus +
              lVar15);
        pVar16 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::_M_get_insert_equal_pos
                           ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this_00,__k);
        local_128._prim_part._M_dataplus._M_p = (pointer)this_00;
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this_00,pVar16.first,pVar16.second,__k,(_Alloc_node *)&local_128);
        uVar14 = uVar14 + 1;
        pPVar13 = (this->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar15 = lVar15 + 0x350;
        bVar7 = uVar14 < (ulong)(((long)(this->_children).
                                        super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar13
                                 >> 4) * 0x21cfb2b78c13521d);
      } while (bVar7);
    }
  }
  pPVar13 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_160 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_148 = local_138;
  pcVar3 = (child_prim_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,pcVar3,pcVar3 + child_prim_name->_M_string_length);
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_148,local_140 + (long)local_148);
  paVar2 = &local_128._prim_part.field_2;
  local_128._prim_part._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_50,local_48 + (long)local_50);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,local_128._prim_part._M_dataplus._M_p,
             local_128._prim_part._M_dataplus._M_p + local_128._prim_part._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._prim_part._M_dataplus._M_p != paVar2) {
    operator_delete(local_128._prim_part._M_dataplus._M_p,
                    local_128._prim_part.field_2._M_allocated_capacity + 1);
  }
  local_128._prim_part._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  sVar6 = local_128._prim_part._M_string_length;
  __s2._M_p = local_128._prim_part._M_dataplus._M_p;
  lVar15 = ((long)local_160 - (long)pPVar13 >> 4) * 0x21cfb2b78c13521d >> 2;
  if (0 < lVar15) {
    local_58 = pPVar13 + lVar15 * 4;
    lVar15 = lVar15 + 1;
    this_02 = pPVar13 + 2;
    do {
      sVar4 = this_02[-2]._elementPath._prim_part._M_string_length;
      if ((sVar4 == sVar6) &&
         ((sVar4 == 0 ||
          (iVar8 = bcmp(this_02[-2]._elementPath._prim_part._M_dataplus._M_p,__s2._M_p,sVar4),
          iVar8 == 0)))) {
        this_02 = this_02 + -2;
        goto LAB_0029c598;
      }
      sVar4 = this_02[-1]._elementPath._prim_part._M_string_length;
      if ((sVar4 == sVar6) &&
         ((sVar4 == 0 ||
          (iVar8 = bcmp(this_02[-1]._elementPath._prim_part._M_dataplus._M_p,__s2._M_p,sVar4),
          iVar8 == 0)))) {
        this_02 = this_02 + -1;
        goto LAB_0029c598;
      }
      sVar4 = (this_02->_elementPath)._prim_part._M_string_length;
      if ((sVar4 == sVar6) &&
         ((sVar4 == 0 ||
          (iVar8 = bcmp((this_02->_elementPath)._prim_part._M_dataplus._M_p,__s2._M_p,sVar4),
          iVar8 == 0)))) goto LAB_0029c598;
      sVar4 = this_02[1]._elementPath._prim_part._M_string_length;
      if ((sVar4 == sVar6) &&
         ((sVar4 == 0 ||
          (iVar8 = bcmp(this_02[1]._elementPath._prim_part._M_dataplus._M_p,__s2._M_p,sVar4),
          iVar8 == 0)))) {
        this_02 = this_02 + 1;
        goto LAB_0029c598;
      }
      lVar15 = lVar15 + -1;
      this_02 = this_02 + 4;
      pPVar13 = local_58;
    } while (1 < lVar15);
  }
  lVar15 = ((long)local_160 - (long)pPVar13 >> 4) * 0x21cfb2b78c13521d;
  if (lVar15 == 1) {
LAB_0029c53c:
    sVar4 = (pPVar13->_elementPath)._prim_part._M_string_length;
    this_02 = local_160;
    if (((sVar4 == local_128._prim_part._M_string_length) && (this_02 = pPVar13, sVar4 != 0)) &&
       (iVar8 = bcmp((pPVar13->_elementPath)._prim_part._M_dataplus._M_p,
                     local_128._prim_part._M_dataplus._M_p,sVar4), iVar8 != 0)) {
      this_02 = local_160;
    }
  }
  else if (lVar15 == 2) {
LAB_0029c50d:
    sVar4 = (pPVar13->_elementPath)._prim_part._M_string_length;
    if ((sVar4 != local_128._prim_part._M_string_length) ||
       ((this_02 = pPVar13, sVar4 != 0 &&
        (iVar8 = bcmp((pPVar13->_elementPath)._prim_part._M_dataplus._M_p,
                      local_128._prim_part._M_dataplus._M_p,sVar4), iVar8 != 0)))) {
      pPVar13 = pPVar13 + 1;
      goto LAB_0029c53c;
    }
  }
  else {
    this_02 = local_160;
    if ((lVar15 == 3) &&
       ((sVar4 = (pPVar13->_elementPath)._prim_part._M_string_length,
        sVar4 != local_128._prim_part._M_string_length ||
        ((this_02 = pPVar13, sVar4 != 0 &&
         (iVar8 = bcmp((pPVar13->_elementPath)._prim_part._M_dataplus._M_p,
                       local_128._prim_part._M_dataplus._M_p,sVar4), iVar8 != 0)))))) {
      pPVar13 = pPVar13 + 1;
      goto LAB_0029c50d;
    }
  }
LAB_0029c598:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._prim_part._M_dataplus._M_p != &local_128._prim_part.field_2) {
    operator_delete(local_128._prim_part._M_dataplus._M_p,
                    local_128._prim_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_148 != local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  pPVar13 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  rhs_00 = &local_158->_data;
  bVar7 = SetPrimElementName(rhs_00,child_prim_name);
  psVar10 = local_150;
  if (this_02 == pPVar13) {
    if (!bVar7) goto LAB_0029c9a4;
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
    Path::Path(&local_128,child_prim_name,&local_180);
    Path::operator=(&local_158->_elementPath,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._element._M_dataplus._M_p != &local_128._element.field_2) {
      operator_delete(local_128._element._M_dataplus._M_p,
                      local_128._element.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._variant_part_str._M_dataplus._M_p != &local_128._variant_part_str.field_2) {
      operator_delete(local_128._variant_part_str._M_dataplus._M_p,
                      local_128._variant_part_str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._variant_selection_part._M_dataplus._M_p !=
        &local_128._variant_selection_part.field_2) {
      operator_delete(local_128._variant_selection_part._M_dataplus._M_p,
                      local_128._variant_selection_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._variant_part._M_dataplus._M_p != &local_128._variant_part.field_2) {
      operator_delete(local_128._variant_part._M_dataplus._M_p,
                      local_128._variant_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._prop_part._M_dataplus._M_p != &local_128._prop_part.field_2) {
      operator_delete(local_128._prop_part._M_dataplus._M_p,
                      local_128._prop_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._prim_part._M_dataplus._M_p != &local_128._prim_part.field_2) {
      operator_delete(local_128._prim_part._M_dataplus._M_p,
                      local_128._prim_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    pVar16 = ::std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::_M_get_insert_equal_pos
                       ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_00,child_prim_name);
    local_128._prim_part._M_dataplus._M_p = (pointer)this_00;
    ::std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    _M_insert_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,pVar16.first,pVar16.second,child_prim_name,(_Alloc_node *)&local_128);
    ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)&this->_children,local_158
              );
  }
  else {
    if (!bVar7) {
LAB_0029c9a4:
      if (local_150 != (string *)0x0) {
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,"Internal error. cannot modify Prim\'s elementName.\n","");
        fmt::format((string *)&local_128,&local_180);
        ::std::__cxx11::string::operator=((string *)psVar10,(string *)&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._prim_part._M_dataplus._M_p != &local_128._prim_part.field_2) {
          operator_delete(local_128._prim_part._M_dataplus._M_p,
                          local_128._prim_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
      }
      return false;
    }
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
    Path::Path(&local_128,child_prim_name,&local_180);
    this_01 = &local_158->_elementPath;
    Path::operator=(this_01,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._element._M_dataplus._M_p != &local_128._element.field_2) {
      operator_delete(local_128._element._M_dataplus._M_p,
                      local_128._element.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._variant_part_str._M_dataplus._M_p != &local_128._variant_part_str.field_2) {
      operator_delete(local_128._variant_part_str._M_dataplus._M_p,
                      local_128._variant_part_str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._variant_selection_part._M_dataplus._M_p !=
        &local_128._variant_selection_part.field_2) {
      operator_delete(local_128._variant_selection_part._M_dataplus._M_p,
                      local_128._variant_selection_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._variant_part._M_dataplus._M_p != &local_128._variant_part.field_2) {
      operator_delete(local_128._variant_part._M_dataplus._M_p,
                      local_128._variant_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._prop_part._M_dataplus._M_p != &local_128._prop_part.field_2) {
      operator_delete(local_128._prop_part._M_dataplus._M_p,
                      local_128._prop_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._prim_part._M_dataplus._M_p != &local_128._prim_part.field_2) {
      operator_delete(local_128._prim_part._M_dataplus._M_p,
                      local_128._prim_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    pPVar5 = local_158;
    Path::operator=(&this_02->_abs_path,&local_158->_abs_path);
    Path::operator=(&this_02->_path,&pPVar5->_path);
    Path::operator=(&this_02->_elementPath,this_01);
    ::std::__cxx11::string::operator=
              ((string *)&this_02->_prim_type_name,(string *)&pPVar5->_prim_type_name);
    this_02->_specifier = pPVar5->_specifier;
    linb::any::operator=(&(this_02->_data).v_,&rhs_00->v_);
    ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::_M_move_assign
              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)&this_02->_children,
               &pPVar5->_children);
    ::std::
    multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this_02->_childrenNameSet,&pPVar5->_childrenNameSet);
    bVar7 = pPVar5->_primChildrenIndicesIsValid;
    this_02->_child_dirty = pPVar5->_child_dirty;
    this_02->_primChildrenIndicesIsValid = bVar7;
    ::std::vector<long,_std::allocator<long>_>::_M_move_assign
              ((vector<long,_std::allocator<long>_> *)&this_02->_primChildrenIndices,
               &pPVar5->_primChildrenIndices);
    this_02->_prim_id = pPVar5->_prim_id;
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
    ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                 *)&this_02->_variantSets,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                 *)&pPVar5->_variantSets);
  }
  this->_child_dirty = true;
  return true;
}

Assistant:

bool Prim::replace_child(const std::string &child_prim_name, Prim &&rhs,
                         std::string *err) {
#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (child_prim_name.empty()) {
    if (err) {
      (*err) += "child_prim_name is empty.\n";
    }
  }

  if (!ValidatePrimElementName(child_prim_name)) {
    if (err) {
      (*err) +=
          fmt::format("`{}` is not a valid Prim name.\n", child_prim_name);
    }
  }

  if (_children.size() != _childrenNameSet.size()) {
    // Rebuild _childrenNames
    _childrenNameSet.clear();
    for (size_t i = 0; i < _children.size(); i++) {
      if (_children[i].element_name().empty()) {
        if (err) {
          (*err) =
              "Internal error: Existing child Prim's elementName is empty.\n";
        }
        return false;
      }

      if (_childrenNameSet.count(_children[i].element_name())) {
        if (err) {
          (*err) =
              "Internal error: _children contains Prim with same "
              "elementName.\n";
        }
        return false;
      }

      _childrenNameSet.insert(_children[i].element_name());
    }
  }

  // Simple linear scan
  auto result = std::find_if(_children.begin(), _children.end(),
                             [child_prim_name](const Prim &p) {
                               return (p.element_name() == child_prim_name);
                             });

  if (result != _children.end()) {
    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(rhs.get_data(), child_prim_name)) {
      if (err) {
        (*err) =
            fmt::format("Internal error. cannot modify Prim's elementName.\n");
      }
      return false;
    }
    rhs.element_path() = Path(child_prim_name, /* prop_part */ "");

    (*result) = std::move(rhs);  // replace

  } else {
    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(rhs.get_data(), child_prim_name)) {
      if (err) {
        (*err) =
            fmt::format("Internal error. cannot modify Prim's elementName.\n");
      }
      return false;
    }
    rhs.element_path() = Path(child_prim_name, /* prop_part */ "");

    _childrenNameSet.insert(child_prim_name);
    _children.emplace_back(std::move(rhs));  // add
  }

  _child_dirty = true;

  return true;
}